

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O2

float collision_cleanup(features *fs)

{
  float *pfVar1;
  unsigned_long *puVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  unsigned_long *puVar6;
  unsigned_long uVar7;
  float fVar8;
  iterator pos;
  
  puVar2 = (fs->indicies)._begin;
  pfVar1 = (fs->values)._end;
  uVar7 = 0xffffffffffffffff;
  fVar8 = 0.0;
  pfVar5 = (fs->values)._begin;
  pfVar3 = pfVar5;
  puVar6 = puVar2;
  for (; pfVar5 != pfVar1; pfVar5 = pfVar5 + 1) {
    if (uVar7 == *puVar6) {
      *pfVar3 = *pfVar5 + *pfVar3;
      pfVar4 = pfVar3;
    }
    else {
      fVar8 = fVar8 + *pfVar3 * *pfVar3;
      pfVar4 = pfVar3 + 1;
      puVar2 = puVar2 + 1;
      pfVar3[1] = *pfVar5;
      uVar7 = *puVar6;
      *puVar2 = uVar7;
    }
    puVar6 = puVar6 + 1;
    pfVar3 = pfVar4;
  }
  fVar8 = *pfVar3 * *pfVar3 + fVar8;
  fs->sum_feat_sq = fVar8;
  pos.super_features_value_iterator._begin = pfVar3 + 1;
  pos._begin_index = puVar2 + 1;
  features::truncate_to(fs,&pos.super_features_value_iterator);
  return fVar8;
}

Assistant:

float collision_cleanup(features& fs)
{
  uint64_t last_index = (uint64_t)-1;
  float sum_sq = 0.f;
  features::iterator pos = fs.begin();
  for (features::iterator& f : fs)
  {
    if (last_index == f.index())
      pos.value() += f.value();
    else
    {
      sum_sq += pos.value() * pos.value();
      ++pos;
      pos.value() = f.value();
      pos.index() = f.index();
      last_index = f.index();
    }
  }

  sum_sq += pos.value() * pos.value();
  fs.sum_feat_sq = sum_sq;
  ++pos;
  fs.truncate_to(pos);

  return sum_sq;
}